

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O3

KTXTexture2 __thiscall
ktx::transcode<false>
          (ktx *this,KTXTexture2 *texture,OptionsTranscodeTarget<false> *options,Reporter *report)

{
  int iVar1;
  Color *pCVar2;
  ktxTexture2 *pkVar3;
  byte bVar4;
  ktx_uint32_t kVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  ulong uVar10;
  KTXTexture2 *pKVar11;
  ktx_uint32_t kVar12;
  KTXTexture2 *pKVar13;
  ktx_uint32_t kVar14;
  undefined **ppuVar15;
  string_view swizzle;
  string_view swizzle_00;
  string_view swizzle_01;
  string_view swizzle_02;
  r8image dstImage;
  KTXTexture2 convertedTexture;
  rgba8image srcImage;
  ktx_size_t dstImageOffset;
  ktx_size_t srcImageOffset;
  ImageT<unsigned_char,_3U> local_d8;
  KTXTexture2 local_b0;
  ulong local_a8;
  uint local_a0;
  ktx_uint32_t local_9c;
  ImageT<unsigned_char,_4U> local_98;
  ulong uStack_70;
  KTXTexture2 *local_60;
  ktxTexture2 *local_58;
  OptionsTranscodeTarget<false> *local_50;
  ulong local_48;
  ktx_size_t local_40;
  ktx_size_t local_38;
  
  OptionsTranscodeTarget<false>::validateTextureTranscode(options,texture,report);
  if ((options->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
      super__Optional_payload_base<ktx_transcode_fmt_e>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  iVar1 = ktxTexture2_TranscodeBasis
                    (texture->handle_,
                     (options->transcodeTarget).
                     super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx_transcode_fmt_e>._M_payload._M_value,0);
  if (iVar1 != 0) {
    local_98.super_Image._vptr_Image = (_func_int **)ktxErrorString(iVar1);
    Reporter::fatal<char_const(&)[37],char_const*>
              (report,INVALID_FILE,(char (*) [37])"Failed to transcode KTX2 texture: {}",
               (char **)&local_98);
  }
  uVar8 = options->transcodeSwizzleComponents;
  pKVar13 = texture;
  if (uVar8 == 0) {
    local_b0.handle_ = (ktxTexture2 *)0x0;
  }
  else {
    if (uVar8 == 4) {
      iVar1 = std::__cxx11::string::compare((char *)&options->transcodeSwizzle);
      local_b0.handle_ = (ktxTexture2 *)0x0;
      pKVar11 = texture;
      if (iVar1 == 0) goto LAB_0019217a;
    }
    else {
      local_b0.handle_ = (ktxTexture2 *)0x0;
      local_98.freePixels = false;
      local_98._33_7_ = 0;
      uStack_70 = 0;
      local_98.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
      local_98.super_Image.primaries = KHR_DF_PRIMARIES_UNSPECIFIED;
      local_98.pixels = (Color *)0x0;
      local_98.super_Image._vptr_Image = (_func_int **)0x0;
      local_98.super_Image.width = 0;
      local_98.super_Image.height = 0;
      pkVar3 = texture->handle_;
      if (uVar8 == 3) {
        uVar6 = 0x1d;
        uVar7 = 0x17;
      }
      else if (uVar8 == 2) {
        uVar6 = 0x16;
        uVar7 = 0x10;
      }
      else {
        if (uVar8 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                        ,0x7d,
                        "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                       );
        }
        uVar6 = 0xf;
        uVar7 = 9;
      }
      if (pkVar3->vkFormat == 0x2b) {
        uVar7 = uVar6;
      }
      local_98.super_Image._vptr_Image = (_func_int **)((ulong)uVar7 << 0x20);
      local_98.super_Image.transferFunction = pkVar3->baseWidth;
      local_98.super_Image.primaries = pkVar3->baseHeight;
      local_98.pixels = *(Color **)&pkVar3->baseDepth;
      local_98._32_4_ = pkVar3->numLevels;
      local_98._36_4_ = pkVar3->numLayers;
      uStack_70 = (ulong)CONCAT24(CONCAT11(pkVar3->generateMipmaps,pkVar3->isArray),pkVar3->numFaces
                                 );
      local_98.super_Image.width = 0;
      local_98.super_Image.height = 0;
      iVar1 = ktxTexture2_Create(&local_98,1,&local_b0);
      if (iVar1 != 0) {
        local_d8.super_Image._vptr_Image = (_func_int **)ktxErrorString(iVar1);
        Reporter::fatal<char_const(&)[36],char_const*>
                  (report,IO_FAILURE,(char (*) [36])"Failed to create output texture: {}",
                   (char **)&local_d8);
      }
      pKVar11 = &local_b0;
      if (local_b0.handle_ == (ktxTexture2 *)0x0) {
        pKVar11 = texture;
      }
    }
    pkVar3 = texture->handle_;
    pKVar13 = pKVar11;
    if (pkVar3->numLevels != 0) {
      local_60 = pKVar11;
      local_50 = options;
      local_58 = (ktxTexture2 *)this;
      kVar5 = 0;
      do {
        bVar4 = (byte)kVar5;
        uVar7 = pkVar3->baseWidth >> (bVar4 & 0x1f);
        uVar8 = uVar7 + (uVar7 == 0);
        uVar7 = pkVar3->baseHeight >> (bVar4 & 0x1f);
        uVar9 = uVar7 + (uVar7 == 0);
        if (pkVar3->numFaces != 0) {
          uVar7 = pkVar3->baseDepth >> (bVar4 & 0x1f);
          local_a0 = uVar7 + (uVar7 == 0);
          local_a8 = 0;
          local_9c = kVar5;
          do {
            if (pkVar3->numLayers != 0) {
              kVar14 = 0;
              do {
                uVar10 = 0;
                do {
                  kVar12 = (int)local_a8 + (int)uVar10;
                  local_48 = uVar10;
                  (*texture->handle_->vtbl->GetImageOffset)
                            ((ktxTexture *)texture->handle_,kVar5,kVar14,kVar12,&local_38);
                  (*pKVar11->handle_->vtbl->GetImageOffset)
                            ((ktxTexture *)pKVar11->handle_,kVar5,kVar14,kVar12,&local_40);
                  local_98.pixels = (Color *)(texture->handle_->pData + local_38);
                  pCVar2 = (Color *)(pKVar11->handle_->pData + local_40);
                  local_98.super_Image.height = uVar9;
                  local_98.super_Image.width = uVar8;
                  local_98.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                  local_98.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                  local_98.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025c808;
                  local_98._32_8_ = local_98._32_8_ & 0xffffffffffffff00;
                  switch(local_50->transcodeSwizzleComponents) {
                  case 1:
                    local_d8.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                    local_d8.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                    ppuVar15 = &PTR__ImageT_0025d470;
                    local_d8.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025d470;
                    local_d8.freePixels = false;
                    swizzle_00._M_str = (local_50->transcodeSwizzle)._M_dataplus._M_p;
                    swizzle_00._M_len = (local_50->transcodeSwizzle)._M_string_length;
                    local_d8.super_Image.width = uVar8;
                    local_d8.super_Image.height = uVar9;
                    local_d8.pixels = (Color *)pCVar2;
                    ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,1u>>
                              ((ImageT<unsigned_char,4u> *)&local_98,
                               (ImageT<unsigned_char,_1U> *)&local_d8,swizzle_00);
                    break;
                  case 2:
                    local_d8.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                    local_d8.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                    ppuVar15 = &PTR__ImageT_0025d568;
                    local_d8.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025d568;
                    local_d8.freePixels = false;
                    swizzle_02._M_str = (local_50->transcodeSwizzle)._M_dataplus._M_p;
                    swizzle_02._M_len = (local_50->transcodeSwizzle)._M_string_length;
                    local_d8.super_Image.width = uVar8;
                    local_d8.super_Image.height = uVar9;
                    local_d8.pixels = (Color *)pCVar2;
                    ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,2u>>
                              ((ImageT<unsigned_char,4u> *)&local_98,
                               (ImageT<unsigned_char,_2U> *)&local_d8,swizzle_02);
                    break;
                  case 3:
                    local_d8.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                    local_d8.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                    ppuVar15 = &PTR__ImageT_0025d660;
                    local_d8.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025d660;
                    local_d8.freePixels = false;
                    swizzle_01._M_str = (local_50->transcodeSwizzle)._M_dataplus._M_p;
                    swizzle_01._M_len = (local_50->transcodeSwizzle)._M_string_length;
                    local_d8.super_Image.width = uVar8;
                    local_d8.super_Image.height = uVar9;
                    local_d8.pixels = (Color *)pCVar2;
                    ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,3u>>
                              ((ImageT<unsigned_char,4u> *)&local_98,&local_d8,swizzle_01);
                    break;
                  case 4:
                    if (local_98.pixels != pCVar2) {
                      __assert_fail("srcImageData == dstImageData",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                                    ,0xb6,
                                    "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                                   );
                    }
                    swizzle._M_str = (local_50->transcodeSwizzle)._M_dataplus._M_p;
                    swizzle._M_len = (local_50->transcodeSwizzle)._M_string_length;
                    ImageT<unsigned_char,_4U>::swizzle(&local_98,swizzle);
                    goto LAB_00192103;
                  default:
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                                  ,0xbb,
                                  "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                                 );
                  }
                  local_d8.super_Image._vptr_Image = (_func_int **)ppuVar15;
                  if (local_d8.freePixels == true) {
                    free(local_d8.pixels);
                  }
LAB_00192103:
                  local_98.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025c808;
                  if (local_98.freePixels == true) {
                    free(local_98.pixels);
                  }
                  uVar7 = (int)local_48 + 1;
                  uVar10 = (ulong)uVar7;
                  kVar5 = local_9c;
                } while (local_a0 != uVar7);
                kVar14 = kVar14 + 1;
                pkVar3 = texture->handle_;
              } while (kVar14 < pkVar3->numLayers);
            }
            uVar7 = (int)local_a8 + 1;
            local_a8 = (ulong)uVar7;
          } while (uVar7 < pkVar3->numFaces);
        }
        kVar5 = kVar5 + 1;
        pKVar13 = local_60;
        this = (ktx *)local_58;
      } while (kVar5 < pkVar3->numLevels);
    }
  }
LAB_0019217a:
  *(ktxTexture2 **)this = pKVar13->handle_;
  pKVar13->handle_ = (ktxTexture2 *)0x0;
  if (local_b0.handle_ != (ktxTexture2 *)0x0) {
    (*(local_b0.handle_)->vtbl->Destroy)((ktxTexture *)local_b0.handle_);
  }
  return (KTXTexture2)(ktxTexture2 *)this;
}

Assistant:

KTXTexture2 transcode(KTXTexture2&& texture, OptionsTranscodeTarget<TRANSCODE_CMD>& options, Reporter& report) {
    options.validateTextureTranscode(texture, report);

    auto ret = ktxTexture2_TranscodeBasis(texture, options.transcodeTarget.value(), 0);
    if (ret != KTX_SUCCESS)
        report.fatal(rc::INVALID_FILE, "Failed to transcode KTX2 texture: {}", ktxErrorString(ret));

    // Need to perform format conversion and swizzling if needed
    bool needFormatConversion = false;
    bool needSwizzle = false;
    if (options.transcodeSwizzleComponents != 0) {
        if (options.transcodeSwizzleComponents == 4) {
            if (options.transcodeSwizzle != "rgba") {
                needSwizzle = true;
            }
        } else {
            needFormatConversion = true;
            needSwizzle = true;
        }
    }

    KTXTexture2 convertedTexture{nullptr};
    if (needFormatConversion) {
        ktxTextureCreateInfo createInfo;
        std::memset(&createInfo, 0, sizeof(createInfo));

        const bool srgb = (texture->vkFormat == VK_FORMAT_R8G8B8A8_SRGB);
        switch (options.transcodeSwizzleComponents) {
        case 1:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8_SRGB : VK_FORMAT_R8_UNORM;
            break;
        case 2:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8_SRGB : VK_FORMAT_R8G8_UNORM;
            break;
        case 3:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8B8_SRGB : VK_FORMAT_R8G8B8_UNORM;
            break;
        default:
            assert(false);
        }

        createInfo.baseWidth = texture->baseWidth;
        createInfo.baseHeight = texture->baseHeight;
        createInfo.baseDepth = texture->baseDepth;
        createInfo.generateMipmaps = texture->generateMipmaps;
        createInfo.isArray = texture->isArray;
        createInfo.numDimensions = texture->numDimensions;
        createInfo.numFaces = texture->numFaces;
        createInfo.numLayers = texture->numLayers;
        createInfo.numLevels = texture->numLevels;
        createInfo.pDfd = nullptr;

        ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, convertedTexture.pHandle());
        if (KTX_SUCCESS != ret)
            report.fatal(rc::IO_FAILURE, "Failed to create output texture: {}", ktxErrorString(ret));
    }

    KTXTexture2& outputTexture = (convertedTexture.handle() != nullptr) ? convertedTexture : texture;
    if (needFormatConversion || needSwizzle) {
        for (uint32_t levelIndex = 0; levelIndex < texture->numLevels; ++levelIndex) {
            const auto imageWidth = std::max(1u, texture->baseWidth >> levelIndex);
            const auto imageHeight = std::max(1u, texture->baseHeight >> levelIndex);
            const auto imageDepth = std::max(1u, texture->baseDepth >> levelIndex);

            for (uint32_t faceIndex = 0; faceIndex < texture->numFaces; ++faceIndex) {
                for (uint32_t layerIndex = 0; layerIndex < texture->numLayers; ++layerIndex) {
                    for (uint32_t depthIndex = 0; depthIndex < imageDepth; ++depthIndex) {
                        ktx_size_t srcImageOffset;
                        ktxTexture_GetImageOffset(texture, levelIndex, layerIndex, faceIndex + depthIndex, &srcImageOffset);
                        ktx_size_t dstImageOffset;
                        ktxTexture_GetImageOffset(outputTexture, levelIndex, layerIndex, faceIndex + depthIndex, &dstImageOffset);

                        auto srcImageData = texture->pData + srcImageOffset;
                        auto dstImageData = outputTexture->pData + dstImageOffset;

                        rgba8image srcImage(imageWidth, imageHeight, reinterpret_cast<rgba8color*>(srcImageData));

                        switch (options.transcodeSwizzleComponents) {
                        case 1: {
                            r8image dstImage(imageWidth, imageHeight, reinterpret_cast<r8color*>(dstImageData));
                            srcImage.copyToR(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 2: {
                            rg8image dstImage(imageWidth, imageHeight, reinterpret_cast<rg8color*>(dstImageData));
                            srcImage.copyToRG(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 3: {
                            rgb8image dstImage(imageWidth, imageHeight, reinterpret_cast<rgb8color*>(dstImageData));
                            srcImage.copyToRGB(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 4: {
                            // Swizzle in-place
                            assert(srcImageData == dstImageData);
                            srcImage.swizzle(options.transcodeSwizzle);
                            break;
                        }
                        default:
                            assert(false);
                        }
                    }
                }
            }
        }
    }

    return std::move(outputTexture);
}